

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.h
# Opt level: O3

void __thiscall embree::FileStream::~FileStream(FileStream *this)

{
  ~FileStream(this);
  operator_delete(this);
  return;
}

Assistant:

~FileStream() { 
      if (ifs) ifs.close();
    }